

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_linkingToUnitsInAnotherModelReturnsUnlinked_Test::TestBody
          (Units_linkingToUnitsInAnotherModelReturnsUnlinked_Test *this)

{
  byte bVar1;
  AssertHelper local_b0 [8];
  Message local_a8 [8];
  char *local_a0 [4];
  ComponentPtr c1;
  AssertionResult gtest_ar_;
  VariablePtr v2;
  VariablePtr v1;
  UnitsPtr u1;
  ModelPtr m1;
  ModelPtr m2;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"m1",(allocator<char> *)&m2)
  ;
  libcellml::Model::create((string *)&m1);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"m2",(allocator<char> *)&c1)
  ;
  libcellml::Model::create((string *)&m2);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"c1",(allocator<char> *)&u1)
  ;
  libcellml::Component::create((string *)&c1);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"u1",(allocator<char> *)&v1)
  ;
  libcellml::Units::create((string *)&u1);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"v1",(allocator<char> *)&v2)
  ;
  libcellml::Variable::create((string *)&v1);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"v2",(allocator<char> *)&gtest_ar_);
  libcellml::Variable::create((string *)&v2);
  std::__cxx11::string::~string((string *)local_a0);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             m1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::setUnits
            ((shared_ptr *)
             v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"second",(allocator<char> *)&gtest_ar_);
  libcellml::Variable::setUnits
            ((string *)v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::__cxx11::string::~string((string *)local_a0);
  libcellml::Model::addUnits
            ((shared_ptr *)
             m2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar1 = libcellml::Model::linkUnits();
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message(local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_a0,&gtest_ar_.success_,"m1->linkUnits()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x273,local_a0[0]);
    testing::internal::AssertHelper::operator=(local_b0,local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    std::__cxx11::string::~string((string *)local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = (bool)libcellml::Model::hasUnlinkedUnits();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_a0,&gtest_ar_.success_,"m1->hasUnlinkedUnits()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x274,local_a0[0]);
    testing::internal::AssertHelper::operator=(local_b0,local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    std::__cxx11::string::~string((string *)local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, linkingToUnitsInAnotherModelReturnsUnlinked)
{
    auto m1 = libcellml::Model::create("m1");
    auto m2 = libcellml::Model::create("m2");
    auto c1 = libcellml::Component::create("c1");
    auto u1 = libcellml::Units::create("u1");
    auto v1 = libcellml::Variable::create("v1");
    auto v2 = libcellml::Variable::create("v2");

    c1->addVariable(v1);
    c1->addVariable(v2);
    m1->addComponent(c1);
    v1->setUnits(u1);
    v2->setUnits("second");

    m2->addUnits(u1); // Units assigned to v1 exist in a different model.

    EXPECT_FALSE(m1->linkUnits());
    EXPECT_TRUE(m1->hasUnlinkedUnits());
}